

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O3

void PrintSensIC(N_Vector y,N_Vector yp,N_Vector *yS,N_Vector *ypS)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer(y->content);
  printf("                  Sensitivity 1  ");
  printf("\n\ts1 = ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(yp->content);
  printf("\ts1\'= ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  printf("                  Sensitivity 2  ");
  puVar1 = (undefined8 *)N_VGetArrayPointer(y->ops);
  printf("\n\ts2 = ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(yp->ops);
  printf("\ts2\'= ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  printf("                  Sensitivity 3  ");
  puVar1 = (undefined8 *)N_VGetArrayPointer(y->sunctx);
  printf("\n\ts3 = ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  puVar1 = (undefined8 *)N_VGetArrayPointer(yp->sunctx);
  printf("\ts3\'= ");
  printf("%12.4e %12.4e %12.4e \n",*puVar1,puVar1[1],puVar1[2]);
  return;
}

Assistant:

static void PrintSensIC(N_Vector y, N_Vector yp, N_Vector* yS, N_Vector* ypS)
{
  sunrealtype* sdata;

  sdata = N_VGetArrayPointer(yS[0]);
  printf("                  Sensitivity 1  ");

  printf("\n\ts1 = ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif
  sdata = N_VGetArrayPointer(ypS[0]);
  printf("\ts1'= ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif

  printf("                  Sensitivity 2  ");
  sdata = N_VGetArrayPointer(yS[1]);
  printf("\n\ts2 = ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif
  sdata = N_VGetArrayPointer(ypS[1]);
  printf("\ts2'= ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif

  printf("                  Sensitivity 3  ");
  sdata = N_VGetArrayPointer(yS[2]);
  printf("\n\ts3 = ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif
  sdata = N_VGetArrayPointer(ypS[2]);
  printf("\ts3'= ");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%12.4Le %12.4Le %12.4Le \n", sdata[0], sdata[1], sdata[2]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#else
  printf("%12.4e %12.4e %12.4e \n", sdata[0], sdata[1], sdata[2]);
#endif
}